

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.cpp
# Opt level: O2

size_t ellipses::find_weakest_element
                 (vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *ellipses)

{
  long *plVar1;
  pointer pRVar2;
  size_type __n;
  pointer pRVar3;
  float *pfVar4;
  Size2f *pSVar5;
  long lVar6;
  pointer pRVar7;
  long lVar8;
  pointer pfVar9;
  pointer pdVar10;
  size_type sVar11;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var12;
  double dVar13;
  undefined1 auVar14 [16];
  float fVar15;
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  pVar16;
  pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  pVar17;
  allocator_type local_99;
  vector<double,_std::allocator<double>_> distances;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bad_score;
  Point mcenter;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> centers;
  vector<double,_std::allocator<double>_> ratios;
  vector<float,_std::allocator<float>_> angles;
  
  pRVar3 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>)._M_impl
           .super__Vector_impl_data._M_start;
  __n = ((long)(ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>).
               _M_impl.super__Vector_impl_data._M_finish - (long)pRVar3) / 0x14;
  pfVar4 = &(pRVar3->size).height;
  sVar11 = 0;
  while( true ) {
    if (__n == sVar11) {
      distances.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&bad_score,__n,(value_type_conflict1 *)&distances,(allocator_type *)&centers);
      std::vector<double,_std::allocator<double>_>::vector
                (&distances,
                 ((long)(ellipses->
                        super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(ellipses->
                       super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>).
                       _M_impl.super__Vector_impl_data._M_start) / 0x14,(allocator_type *)&centers);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                (&centers,((long)(ellipses->
                                 super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(ellipses->
                                super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>
                                )._M_impl.super__Vector_impl_data._M_start) / 0x14,
                 (allocator_type *)&angles);
      pRVar2 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      for (pRVar3 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>
                    )._M_impl.super__Vector_impl_data._M_start; pRVar3 != pRVar2;
          pRVar3 = pRVar3 + 1) {
        *centers.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
         super__Vector_impl_data._M_start = pRVar3->center;
        centers.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
        super__Vector_impl_data._M_start =
             centers.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      }
      center_of_mass<std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>>(&centers);
      pRVar3 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pRVar2 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      pfVar4 = &(pRVar3->center).y;
      for (lVar6 = 0; ((long)pRVar2 - (long)pRVar3) / 0x14 != lVar6; lVar6 = lVar6 + 1) {
        fVar15 = (float)mcenter.x - ((Point2f *)(pfVar4 + -1))->x;
        distances.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar6] =
             (double)SQRT(fVar15 * fVar15 +
                          ((float)mcenter.y - *pfVar4) * ((float)mcenter.y - *pfVar4));
        pfVar4 = pfVar4 + 5;
      }
      pVar16 = std::
               __minmax_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                         (distances.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          distances.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + 3);
      if (20.0 < *pVar16.second._M_current._M_current) {
        plVar1 = (long *)((long)bad_score.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start +
                         ((long)pVar16.second._M_current._M_current -
                         (long)distances.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start));
        *plVar1 = *plVar1 + 1;
      }
      std::vector<float,_std::allocator<float>_>::vector
                (&angles,((long)(ellipses->
                                super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(ellipses->
                               super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>
                               )._M_impl.super__Vector_impl_data._M_start) / 0x14,
                 (allocator_type *)&ratios);
      pRVar2 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      pRVar3 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pfVar9 = angles.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (pRVar7 = pRVar3; pRVar7 != pRVar2; pRVar7 = pRVar7 + 1) {
        *pfVar9 = pRVar7->angle;
        pfVar9 = pfVar9 + 1;
      }
      fVar15 = 0.0;
      for (pfVar9 = angles.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pfVar9 != angles.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish; pfVar9 = pfVar9 + 1) {
        fVar15 = fVar15 + *pfVar9;
      }
      pfVar4 = &pRVar3->angle;
      for (lVar6 = 0; ((long)pRVar2 - (long)pRVar3) / 0x14 != lVar6; lVar6 = lVar6 + 1) {
        distances.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar6] =
             (double)ABS(fVar15 / (float)(ulong)((long)angles.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                 (long)angles.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start >> 2) -
                         *pfVar4);
        pfVar4 = pfVar4 + 5;
      }
      pVar16 = std::
               __minmax_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                         (distances.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          distances.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + 3);
      plVar1 = (long *)((long)bad_score.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start +
                       ((long)pVar16.second._M_current._M_current -
                       (long)distances.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start));
      *plVar1 = *plVar1 + 1;
      std::vector<double,_std::allocator<double>_>::vector
                (&ratios,((long)(ellipses->
                                super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(ellipses->
                               super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>
                               )._M_impl.super__Vector_impl_data._M_start) / 0x14,&local_99);
      pRVar2 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      pRVar3 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pdVar10 = ratios.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (pRVar7 = pRVar3; pRVar7 != pRVar2; pRVar7 = pRVar7 + 1) {
        *pdVar10 = (double)(pRVar7->size).width / (double)(pRVar7->size).height;
        pdVar10 = pdVar10 + 1;
      }
      dVar13 = 0.0;
      for (pdVar10 = ratios.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pdVar10 !=
          ratios.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
          ._M_finish; pdVar10 = pdVar10 + 1) {
        dVar13 = dVar13 + *pdVar10;
      }
      lVar6 = (long)ratios.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)ratios.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      auVar14._8_4_ =
           (int)((long)ratios.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)ratios.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 0x23);
      auVar14._0_8_ = lVar6;
      auVar14._12_4_ = 0x45300000;
      pSVar5 = &pRVar3->size;
      for (lVar8 = 0; ((long)pRVar2 - (long)pRVar3) / 0x14 != lVar8; lVar8 = lVar8 + 1) {
        distances.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar8] =
             ABS(dVar13 / ((auVar14._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) -
                 (double)(*pSVar5).width / (double)(*pSVar5).height);
        pSVar5 = (Size2f *)&pSVar5[2].height;
      }
      pVar16 = std::
               __minmax_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                         (distances.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          distances.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + 3);
      if (0.01 < *pVar16.second._M_current._M_current) {
        plVar1 = (long *)((long)bad_score.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start +
                         ((long)pVar16.second._M_current._M_current -
                         (long)distances.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start));
        *plVar1 = *plVar1 + 1;
      }
      pVar17 = std::
               __minmax_element<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                         (bad_score.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          bad_score.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish);
      _Var12._M_current = pVar17.second._M_current._M_current;
      if (*pVar17.second._M_current._M_current < 2) {
        _Var12._M_current =
             bad_score.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&ratios.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&angles.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
                (&centers.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                );
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&distances.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&bad_score.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      return (long)_Var12._M_current -
             (long)bad_score.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    }
    if (((((pfVar4[-3] == 0.0) && (!NAN(pfVar4[-3]))) && (pfVar4[-2] == 0.0)) &&
        ((!NAN(pfVar4[-2]) && (((Size2f *)(pfVar4 + -1))->width == 0.0)))) &&
       ((!NAN(((Size2f *)(pfVar4 + -1))->width) && ((*pfVar4 == 0.0 && (!NAN(*pfVar4))))))) break;
    sVar11 = sVar11 + 1;
    pfVar4 = pfVar4 + 5;
  }
  return sVar11;
}

Assistant:

std::size_t find_weakest_element(const std::vector<cv::RotatedRect>& ellipses)
{
    for(std::size_t i = 0; i < ellipses.size(); i++)
    {
        if(ellipses[i].center == cv::Point2f() && ellipses[i].size == cv::Size2f())
        {
            return i;
        }
    }

    std::vector<std::size_t> bad_score(ellipses.size(), 0);
    std::vector<double> distances(ellipses.size());

    std::vector<cv::Point2f> centers(ellipses.size());
    std::transform(
        ellipses.begin(), ellipses.end(), centers.begin(), [](const cv::RotatedRect& e) { return e.center; });
    auto mcenter = center_of_mass(centers);
    for(std::size_t i = 0; i < ellipses.size(); i++)
    {
        distances[i] = euclideanDistance(
            cv::Point2f(static_cast<float>(mcenter.x), static_cast<float>(mcenter.y)), ellipses[i].center);
    }
    auto max = std::minmax_element(distances.begin(), distances.begin() + 3).second;
    if(*max > 20)
        bad_score[std::distance(distances.begin(), max)]++;

    std::vector<float> angles(ellipses.size());
    std::transform(ellipses.begin(), ellipses.end(), angles.begin(), [](const cv::RotatedRect& e) { return e.angle; });
    auto mangles = std::accumulate(angles.begin(), angles.end(), 0.f) / angles.size();
    for(std::size_t i = 0; i < ellipses.size(); i++)
    {
        distances[i] = std::abs(mangles - ellipses[i].angle);
    }
    max = std::minmax_element(distances.begin(), distances.begin() + 3).second;
    bad_score[std::distance(distances.begin(), max)]++;

    std::vector<double> ratios(ellipses.size());
    std::transform(ellipses.begin(), ellipses.end(), ratios.begin(), [](const cv::RotatedRect& e) {
#if CV_MAJOR_VERSION < 3
        return e.size.width / static_cast<double>(e.size.height);
#else //! CV_MAJOR_VERSION > 3
            return e.size.aspectRatio();
#endif // CV_MAJOR_VERSION <> 3
    });
    auto mratios = std::accumulate(ratios.begin(), ratios.end(), 0.) / ratios.size();
    for(std::size_t i = 0; i < ellipses.size(); i++)
    {
#if CV_MAJOR_VERSION < 3
        double aspect = ellipses[i].size.width / static_cast<double>(ellipses[i].size.height);
#else //! CV_MAJOR_VERSION > 3
        double aspect = ellipses[i].size.aspectRatio();
#endif // CV_MAJOR_VERSION <> 3

        distances[i] = std::abs(mratios - aspect);
    }
    max = std::minmax_element(distances.begin(), distances.begin() + 3).second;
    if(*max > 0.01)
        bad_score[std::distance(distances.begin(), max)]++;

    auto max_bad = std::minmax_element(bad_score.begin(), bad_score.end()).second;
    if(*max_bad > 1)
        return std::distance(bad_score.begin(), max_bad);
    return bad_score.size();
}